

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepScanLineInputFile.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_6::reconstructLineOffsets
               (IStream *is,LineOrder lineOrder,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *lineOffsets)

{
  undefined8 uVar1;
  size_type sVar2;
  IStream *pIVar3;
  reference pvVar4;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_RDX;
  int in_ESI;
  long *in_RDI;
  Int64 packed_sample;
  Int64 packed_offset;
  int y;
  Int64 lineOffset;
  uint i;
  Int64 position;
  int in_stack_0000038c;
  IStream *in_stack_00000390;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_stack_ffffffffffffff88;
  IStream *in_stack_ffffffffffffff90;
  undefined4 local_24;
  
  uVar1 = (**(code **)(*in_RDI + 0x28))();
  local_24 = 0;
  while( true ) {
    sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
    if (sVar2 <= local_24) break;
    pIVar3 = (IStream *)(**(code **)(*in_RDI + 0x28))();
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
              (in_stack_ffffffffffffff90,(int *)in_stack_ffffffffffffff88);
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
              (in_stack_ffffffffffffff90,(unsigned_long *)in_stack_ffffffffffffff88);
    Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
              (in_stack_ffffffffffffff90,(unsigned_long *)in_stack_ffffffffffffff88);
    Xdr::skip<Imf_2_5::StreamIO,Imf_2_5::IStream>(in_stack_00000390,in_stack_0000038c);
    if (in_ESI == 0) {
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_RDX,(ulong)local_24);
      *pvVar4 = (value_type)pIVar3;
      pIVar3 = in_stack_ffffffffffffff90;
    }
    else {
      in_stack_ffffffffffffff88 = in_RDX;
      sVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size(in_RDX);
      pvVar4 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                         (in_stack_ffffffffffffff88,(sVar2 - local_24) - 1);
      *pvVar4 = (value_type)pIVar3;
    }
    local_24 = local_24 + 1;
    in_stack_ffffffffffffff90 = pIVar3;
  }
  (**(code **)(*in_RDI + 0x38))();
  (**(code **)(*in_RDI + 0x30))(in_RDI,uVar1);
  return;
}

Assistant:

void
reconstructLineOffsets (OPENEXR_IMF_INTERNAL_NAMESPACE::IStream &is,
                        LineOrder lineOrder,
                        vector<Int64> &lineOffsets)
{
    Int64 position = is.tellg();

    try
    {
        for (unsigned int i = 0; i < lineOffsets.size(); i++)
        {
            Int64 lineOffset = is.tellg();

            int y;
            OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, y);
            
            Int64 packed_offset;
            Int64 packed_sample;
            OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, packed_offset);
            OPENEXR_IMF_INTERNAL_NAMESPACE::Xdr::read <OPENEXR_IMF_INTERNAL_NAMESPACE::StreamIO> (is, packed_sample);
            //next is unpacked sample table size - skip this too
            Xdr::skip <StreamIO> (is, packed_offset+packed_sample+8);

            if (lineOrder == INCREASING_Y)
                lineOffsets[i] = lineOffset;
            else
                lineOffsets[lineOffsets.size() - i - 1] = lineOffset;
        }
    }
    catch (...) //NOSONAR - suppress vulnerability reports from SonarCloud.
    {
        //
        // Suppress all exceptions.  This functions is
        // called only to reconstruct the line offset
        // table for incomplete files, and exceptions
        // are likely.
        //
    }

    is.clear();
    is.seekg (position);
}